

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::UniqueFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  HistogramAggState<float,_std::unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>_>
  **ppHVar1;
  UnifiedVectorFormat *pUVar2;
  idx_t iVar3;
  size_type sVar4;
  UnifiedVectorFormat *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  HistogramAggState<float,_std::unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>_>
  *state;
  idx_t i;
  unsigned_long *result_data;
  HistogramAggState<float,_std::unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat *this;
  UnifiedVectorFormat *local_88;
  SelectionVector *local_60 [9];
  UnifiedVectorFormat *local_18;
  ulong local_10;
  ulong local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_60);
  duckdb::Vector::ToUnifiedFormat(local_10,local_18);
  ppHVar1 = UnifiedVectorFormat::
            GetData<duckdb::HistogramAggState<float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>*>
                      ((UnifiedVectorFormat *)local_60);
  pUVar2 = (UnifiedVectorFormat *)FlatVector::GetData<unsigned_long>((Vector *)0xd8fe26);
  this = pUVar2;
  for (local_88 = (UnifiedVectorFormat *)0x0; local_88 < local_18; local_88 = local_88 + 1) {
    iVar3 = SelectionVector::get_index(local_60[0],(idx_t)local_88);
    if (ppHVar1[iVar3]->hist ==
        (unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>
         *)0x0) {
      *(undefined8 *)(pUVar2 + (long)local_88 * 8) = 0;
    }
    else {
      sVar4 = std::
              unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>
              ::size((unordered_map<float,_unsigned_long,_std::hash<float>,_std::equal_to<float>,_std::allocator<std::pair<const_float,_unsigned_long>_>_>
                      *)0xd8fec1);
      *(size_type *)(pUVar2 + (long)local_88 * 8) = sVar4;
    }
  }
  duckdb::Vector::Verify(local_8);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto result_data = FlatVector::GetData<uint64_t>(result);
		for (idx_t i = 0; i < count; i++) {

			auto state = states[sdata.sel->get_index(i)];

			if (!state->hist) {
				result_data[i] = 0;
				continue;
			}
			result_data[i] = state->hist->size();
		}
		result.Verify(count);
	}